

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&> __thiscall
capnp::_::anon_unknown_18::
ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::find
          (ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import> *this,
          uint id)

{
  size_t sVar1;
  uint in_EDX;
  undefined4 in_register_00000034;
  Import (*arr) [16];
  uint id_local;
  ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import> *this_local;
  
  arr = (Import (*) [16])CONCAT44(in_register_00000034,id);
  sVar1 = kj::size<capnp::_::RpcSystemBase::RpcConnectionState::Import,16ul>(arr);
  if (in_EDX < sVar1) {
    if ((*(uint *)&arr[1][0].importClient.ptr & 1 << ((byte)in_EDX & 0x1f)) == 0) {
      kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&>::Maybe
                ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&> *)this);
    }
    else {
      kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&>::Maybe
                ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&> *)this,*arr + in_EDX)
      ;
    }
  }
  else {
    kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::
    find<unsigned_int&>((HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import> *
                        )this,(uint *)&arr[1][0].appClient);
  }
  return (Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&>)this->low;
}

Assistant:

kj::Maybe<T&> find(Id id) {
    // Look up an entry, returning null if it doesn't exist.
    if (id < kj::size(low)) {
      if (presenceBits & (1 << id)) {
        return low[id];
      } else {
        return kj::none;
      }
    } else {
      return high.find(id);
    }
  }